

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::Data
          (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *this,
          Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *other)

{
  long lVar1;
  bool bVar2;
  Node<QRhiResource_*,_std::pair<int,_bool>_> *pNVar3;
  Node<QRhiResource_*,_std::pair<int,_bool>_> *pNVar4;
  long in_RSI;
  Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  Node<QRhiResource_*,_std::pair<int,_bool>_> *newNode;
  Node<QRhiResource_*,_std::pair<int,_bool>_> *n;
  size_t index;
  Span *span;
  size_t s;
  R r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)(in_RDI->offsets + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI->offsets + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  *(undefined8 *)(in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  RVar5 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar5.spans;
  *(Span **)(in_RDI->offsets + 0x20) = local_28;
  local_20 = RVar5.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar2 = Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::hasNode
                        ((Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)
                         (lVar1 + local_48 * 0x90),local_58);
      if (bVar2) {
        pNVar3 = Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::at
                           (this_00,(size_t)in_RDI);
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        pNVar4 = Bucket::insert((Bucket *)0x94746b);
        pNVar4->key = pNVar3->key;
        pNVar4->value = pNVar3->value;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }